

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

pqpair stat2pq(double val,int code,double p1,double p2,double p3)

{
  int iVar1;
  pqpair pVar2;
  double p3_local;
  double p2_local;
  double p1_local;
  int code_local;
  double val_local;
  pqpair pq;
  
  val_local = 0.0;
  pq.p = 1.0;
  switch(code) {
  case 2:
    pVar2 = correl_s2pq(val,p1);
    pq.p = pVar2.q;
    val_local = pVar2.p;
    break;
  case 3:
    pVar2 = student_s2pq(val,p1);
    pq.p = pVar2.q;
    val_local = pVar2.p;
    break;
  case 4:
    pVar2 = fstat_s2pq(val,p1,p2);
    pq.p = pVar2.q;
    val_local = pVar2.p;
    break;
  case 5:
    pVar2 = normal_s2pq(val);
    pq.p = pVar2.q;
    val_local = pVar2.p;
    break;
  case 6:
    pVar2 = chisq_s2pq(val,p1);
    pq.p = pVar2.q;
    val_local = pVar2.p;
    break;
  case 7:
    pVar2 = beta_s2pq(val,p1,p2);
    pq.p = pVar2.q;
    val_local = pVar2.p;
    break;
  case 8:
    pVar2 = binomial_s2pq(val,p1,p2);
    pq.p = pVar2.q;
    val_local = pVar2.p;
    break;
  case 9:
    pVar2 = gamma_s2pq(val,p1,p2);
    pq.p = pVar2.q;
    val_local = pVar2.p;
    break;
  case 10:
    pVar2 = poisson_s2pq(val,p1);
    pq.p = pVar2.q;
    val_local = pVar2.p;
    break;
  case 0xb:
    if (0.0 < p2) {
      pVar2 = normal_s2pq((val - p1) / p2);
      pq.p = pVar2.q;
      val_local = pVar2.p;
    }
    break;
  case 0xc:
    pVar2 = fnonc_s2pq(val,p1,p2,p3);
    pq.p = pVar2.q;
    val_local = pVar2.p;
    break;
  case 0xd:
    pVar2 = chsqnonc_s2pq(val,p1,p2);
    pq.p = pVar2.q;
    val_local = pVar2.p;
    break;
  case 0xe:
    if (0.0 < p2) {
      pVar2 = logistic_s2pq((val - p1) / p2);
      pq.p = pVar2.q;
      val_local = pVar2.p;
    }
    break;
  case 0xf:
    if (0.0 < p2) {
      pVar2 = laplace_s2pq((val - p1) / p2);
      pq.p = pVar2.q;
      val_local = pVar2.p;
    }
    break;
  case 0x10:
    if (p1 < p2) {
      pVar2 = uniform_s2pq((val - p1) / (p2 - p1));
      pq.p = pVar2.q;
      val_local = pVar2.p;
    }
    break;
  case 0x11:
    pVar2 = tnonc_s2pq(val,p1,p2);
    pq.p = pVar2.q;
    val_local = pVar2.p;
    break;
  case 0x12:
    if ((0.0 < p2) && (0.0 < p3)) {
      pVar2 = weibull_s2pq((val - p1) / p2,p3);
      pq.p = pVar2.q;
      val_local = pVar2.p;
    }
    break;
  case 0x13:
    pVar2 = chi_s2pq(val,p1);
    pq.p = pVar2.q;
    val_local = pVar2.p;
    break;
  case 0x14:
    if ((0.0 < p1) && (0.0 < p2)) {
      pVar2 = invgauss_s2pq(val / p1,p2 / p1);
      pq.p = pVar2.q;
      val_local = pVar2.p;
    }
    break;
  case 0x15:
    if (0.0 < p2) {
      pVar2 = extval1_s2pq((val - p1) / p2);
      pq.p = pVar2.q;
      val_local = pVar2.p;
    }
    break;
  case 0x16:
    if ((0.0 <= val) && (val <= 1.0)) {
      pq.p = val;
    }
    val_local = 1.0 - pq.p;
    break;
  case 0x17:
    iVar1 = (int)val;
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    pq.p = exp((double)-iVar1);
    val_local = 1.0 - pq.p;
    break;
  case 0x18:
    iVar1 = (int)val;
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    pq.p = pow(10.0,(double)-iVar1);
    val_local = 1.0 - pq.p;
  }
  pVar2.q = pq.p;
  pVar2.p = val_local;
  return pVar2;
}

Assistant:

static pqpair stat2pq( double val, int code, double p1,double p2,double p3 )
{
   pqpair pq={0.0,1.0} ;

   switch( code ){

     case NIFTI_INTENT_CORREL:     pq = correl_s2pq  ( val, p1 )      ; break;
     case NIFTI_INTENT_TTEST:      pq = student_s2pq ( val, p1 )      ; break;
     case NIFTI_INTENT_FTEST:      pq = fstat_s2pq   ( val, p1,p2 )   ; break;
     case NIFTI_INTENT_ZSCORE:     pq = normal_s2pq  ( val )          ; break;
     case NIFTI_INTENT_CHISQ:      pq = chisq_s2pq   ( val, p1 )      ; break;
     case NIFTI_INTENT_BETA:       pq = beta_s2pq    ( val, p1,p2 )   ; break;
     case NIFTI_INTENT_BINOM:      pq = binomial_s2pq( val, p1,p2 )   ; break;
     case NIFTI_INTENT_GAMMA:      pq = gamma_s2pq   ( val, p1,p2 )   ; break;
     case NIFTI_INTENT_POISSON:    pq = poisson_s2pq ( val, p1 )      ; break;
     case NIFTI_INTENT_FTEST_NONC: pq = fnonc_s2pq   ( val, p1,p2,p3 ); break;
     case NIFTI_INTENT_CHISQ_NONC: pq = chsqnonc_s2pq( val, p1,p2    ); break;
     case NIFTI_INTENT_TTEST_NONC: pq = tnonc_s2pq   ( val, p1,p2 )   ; break;
     case NIFTI_INTENT_CHI:        pq = chi_s2pq     ( val, p1 )      ; break;

     /* these distributions are shifted and scaled copies of a standard case */

     case NIFTI_INTENT_INVGAUSS:
        if( p1 > 0.0 && p2 > 0.0 ) pq = invgauss_s2pq( val/p1,p2/p1 ) ; break;

     case NIFTI_INTENT_WEIBULL:
        if( p2 > 0.0 && p3 > 0.0 ) pq = weibull_s2pq ((val-p1)/p2,p3) ; break;

     case NIFTI_INTENT_EXTVAL:
                    if( p2 > 0.0 ) pq = extval1_s2pq ( (val-p1)/p2 )  ; break;

     case NIFTI_INTENT_NORMAL:
                    if( p2 > 0.0 ) pq = normal_s2pq  ( (val-p1)/p2 )  ; break;

     case NIFTI_INTENT_LOGISTIC:
                    if( p2 > 0.0 ) pq = logistic_s2pq( (val-p1)/p2 )  ; break;

     case NIFTI_INTENT_LAPLACE:
                    if( p2 > 0.0 ) pq = laplace_s2pq ( (val-p1)/p2 )  ; break;

     case NIFTI_INTENT_UNIFORM:
                    if( p2 > p1  ) pq = uniform_s2pq((val-p1)/(p2-p1)); break;

     /* these cases are trivial (note what is called 'p' is really 'q') */

     case NIFTI_INTENT_PVAL:
                        if( val >= 0.0 && val <= 1.0 ) pq.q = val ;
                                                       pq.p = 1.0-pq.q; break;
     case NIFTI_INTENT_LOGPVAL:
                            pq.q = exp(-abs(val))    ; pq.p = 1.0-pq.q; break;
     case NIFTI_INTENT_LOG10PVAL:
                            pq.q = pow(10.,-abs(val)); pq.p = 1.0-pq.q; break;
   }

   return pq ;
}